

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

bool google::protobuf::internal::
     SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedField<bool>>
               (FieldDescriptor *field)

{
  bool bVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  FieldDescriptor *local_10;
  FieldDescriptor *field_local;
  
  local_10 = field;
  bVar1 = SplitFieldHasExtraIndirection(field);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return true;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"SplitFieldHasExtraIndirection(field)");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/message.h"
             ,0x62a,local_38._M_len,local_38._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

bool SplitFieldHasExtraIndirectionStatic(const FieldDescriptor* field) {
  if (std::is_base_of<RepeatedFieldBase, T>() ||
      std::is_base_of<RepeatedPtrFieldBase, T>()) {
    ABSL_DCHECK(SplitFieldHasExtraIndirection(field));
    return true;
  } else if (std::is_base_of<MessageLite, T>()) {
    ABSL_DCHECK(!SplitFieldHasExtraIndirection(field));
    return false;
  }
  return SplitFieldHasExtraIndirection(field);
}